

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_csr.c
# Opt level: O0

int mbedtls_x509write_csr_der
              (mbedtls_x509write_csr *ctx,uchar *buf,size_t size,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  ulong ilen;
  mbedtls_md_info_t *md_info;
  mbedtls_pk_type_t local_ccc;
  size_t sStack_cc8;
  mbedtls_pk_type_t pk_alg;
  size_t len;
  size_t sig_len;
  size_t sig_and_oid_len;
  size_t pub_len;
  uchar tmp_buf [2048];
  uchar sig [1024];
  uchar hash [64];
  _func_int_void_ptr_uchar_ptr_size_t *local_60;
  uchar *c2;
  uchar *c;
  size_t sig_oid_len;
  char *sig_oid;
  void *pvStack_38;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t size_local;
  uchar *buf_local;
  mbedtls_x509write_csr *ctx_local;
  
  c = (uchar *)0x0;
  sig_and_oid_len = 0;
  sig_len = 0;
  c2 = tmp_buf + 0x7f8;
  pvStack_38 = p_rng;
  p_rng_local = f_rng;
  f_rng_local = (_func_int_void_ptr_uchar_ptr_size_t *)size;
  size_local = (size_t)buf;
  buf_local = (uchar *)ctx;
  sig_oid._4_4_ = mbedtls_x509_write_extensions(&c2,(uchar *)&pub_len,ctx->extensions);
  if (sig_oid._4_4_ < 0) {
    return sig_oid._4_4_;
  }
  sStack_cc8 = (size_t)sig_oid._4_4_;
  if (sStack_cc8 != 0) {
    sig_oid._4_4_ = mbedtls_asn1_write_len(&c2,(uchar *)&pub_len,sStack_cc8);
    if (sig_oid._4_4_ < 0) {
      return sig_oid._4_4_;
    }
    lVar2 = (long)sig_oid._4_4_;
    sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&pub_len,'0');
    if (sig_oid._4_4_ < 0) {
      return sig_oid._4_4_;
    }
    sVar3 = (long)sig_oid._4_4_ + lVar2 + sStack_cc8;
    sig_oid._4_4_ = mbedtls_asn1_write_len(&c2,(uchar *)&pub_len,sVar3);
    if (sig_oid._4_4_ < 0) {
      return sig_oid._4_4_;
    }
    lVar2 = (long)sig_oid._4_4_;
    sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&pub_len,'1');
    if (sig_oid._4_4_ < 0) {
      return sig_oid._4_4_;
    }
    lVar4 = (long)sig_oid._4_4_;
    sig_oid._4_4_ = mbedtls_asn1_write_oid(&c2,(uchar *)&pub_len,anon_var_dwarf_4c99,9);
    if (sig_oid._4_4_ < 0) {
      return sig_oid._4_4_;
    }
    sVar3 = (long)sig_oid._4_4_ + lVar4 + lVar2 + sVar3;
    sig_oid._4_4_ = mbedtls_asn1_write_len(&c2,(uchar *)&pub_len,sVar3);
    if (sig_oid._4_4_ < 0) {
      return sig_oid._4_4_;
    }
    lVar2 = (long)sig_oid._4_4_;
    sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&pub_len,'0');
    if (sig_oid._4_4_ < 0) {
      return sig_oid._4_4_;
    }
    sStack_cc8 = (long)sig_oid._4_4_ + lVar2 + sVar3;
  }
  sig_oid._4_4_ = mbedtls_asn1_write_len(&c2,(uchar *)&pub_len,sStack_cc8);
  ctx_local._4_4_ = sig_oid._4_4_;
  if (-1 < sig_oid._4_4_) {
    lVar2 = (long)sig_oid._4_4_;
    sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&pub_len,0xa0);
    ctx_local._4_4_ = sig_oid._4_4_;
    if (-1 < sig_oid._4_4_) {
      lVar4 = (long)sig_oid._4_4_;
      sig_oid._4_4_ =
           mbedtls_pk_write_pubkey_der
                     (*(mbedtls_pk_context **)buf_local,(uchar *)&pub_len,(long)c2 - (long)&pub_len)
      ;
      ctx_local._4_4_ = sig_oid._4_4_;
      if (-1 < sig_oid._4_4_) {
        sig_and_oid_len = (long)sig_oid._4_4_ + sig_and_oid_len;
        c2 = c2 + -sig_and_oid_len;
        lVar2 = sig_and_oid_len + lVar4 + lVar2 + sStack_cc8;
        sig_oid._4_4_ =
             mbedtls_x509_write_names
                       (&c2,(uchar *)&pub_len,*(mbedtls_asn1_named_data **)(buf_local + 8));
        ctx_local._4_4_ = sig_oid._4_4_;
        if (-1 < sig_oid._4_4_) {
          lVar4 = (long)sig_oid._4_4_;
          sig_oid._4_4_ = mbedtls_asn1_write_int(&c2,(uchar *)&pub_len,0);
          ctx_local._4_4_ = sig_oid._4_4_;
          if (-1 < sig_oid._4_4_) {
            sVar3 = (long)sig_oid._4_4_ + lVar4 + lVar2;
            sig_oid._4_4_ = mbedtls_asn1_write_len(&c2,(uchar *)&pub_len,sVar3);
            ctx_local._4_4_ = sig_oid._4_4_;
            if (-1 < sig_oid._4_4_) {
              lVar2 = (long)sig_oid._4_4_;
              sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&pub_len,'0');
              ctx_local._4_4_ = sig_oid._4_4_;
              if (-1 < sig_oid._4_4_) {
                ilen = (long)sig_oid._4_4_ + lVar2 + sVar3;
                md_info = mbedtls_md_info_from_type(*(mbedtls_md_type_t *)(buf_local + 0x10));
                mbedtls_md(md_info,c2,ilen,sig + 0x3f8);
                local_ccc = mbedtls_pk_get_type(*(mbedtls_pk_context **)buf_local);
                if (local_ccc == MBEDTLS_PK_ECKEY) {
                  local_ccc = MBEDTLS_PK_ECDSA;
                }
                sig_oid._4_4_ =
                     mbedtls_pk_sign(*(mbedtls_pk_context **)buf_local,
                                     *(mbedtls_md_type_t *)(buf_local + 0x10),sig + 0x3f8,0,
                                     tmp_buf + 0x7f8,&len,
                                     (_func_int_void_ptr_uchar_ptr_size_t *)p_rng_local,pvStack_38);
                if ((sig_oid._4_4_ == 0) &&
                   (sig_oid._4_4_ =
                         mbedtls_oid_get_oid_by_sig_alg
                                   (local_ccc,*(mbedtls_md_type_t *)(buf_local + 0x10),
                                    (char **)&sig_oid_len,(size_t *)&c), sig_oid._4_4_ == 0)) {
                  local_60 = f_rng_local + size_local;
                  sig_oid._4_4_ =
                       mbedtls_x509_write_sig
                                 ((uchar **)&local_60,(uchar *)size_local,(char *)sig_oid_len,
                                  (size_t)c,tmp_buf + 0x7f8,len);
                  ctx_local._4_4_ = sig_oid._4_4_;
                  if (-1 < sig_oid._4_4_) {
                    sig_len = (long)sig_oid._4_4_ + sig_len;
                    if ((long)local_60 - size_local < ilen) {
                      ctx_local._4_4_ = -0x6c;
                    }
                    else {
                      local_60 = local_60 + -ilen;
                      memcpy(local_60,c2,ilen);
                      sVar3 = sig_len + ilen;
                      sig_oid._4_4_ =
                           mbedtls_asn1_write_len((uchar **)&local_60,(uchar *)size_local,sVar3);
                      ctx_local._4_4_ = sig_oid._4_4_;
                      if (-1 < sig_oid._4_4_) {
                        iVar1 = sig_oid._4_4_ + (int)sVar3;
                        ctx_local._4_4_ =
                             mbedtls_asn1_write_tag((uchar **)&local_60,(uchar *)size_local,'0');
                        if (-1 < ctx_local._4_4_) {
                          ctx_local._4_4_ = ctx_local._4_4_ + iVar1;
                        }
                      }
                    }
                  }
                }
                else {
                  ctx_local._4_4_ = sig_oid._4_4_;
                }
              }
            }
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_x509write_csr_der( mbedtls_x509write_csr *ctx, unsigned char *buf, size_t size,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret;
    const char *sig_oid;
    size_t sig_oid_len = 0;
    unsigned char *c, *c2;
    unsigned char hash[64];
    unsigned char sig[MBEDTLS_MPI_MAX_SIZE];
    unsigned char tmp_buf[2048];
    size_t pub_len = 0, sig_and_oid_len = 0, sig_len;
    size_t len = 0;
    mbedtls_pk_type_t pk_alg;

    /*
     * Prepare data to be signed in tmp_buf
     */
    c = tmp_buf + sizeof( tmp_buf );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_extensions( &c, tmp_buf, ctx->extensions ) );

    if( len )
    {
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                        MBEDTLS_ASN1_SEQUENCE ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                        MBEDTLS_ASN1_SET ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_oid( &c, tmp_buf, MBEDTLS_OID_PKCS9_CSR_EXT_REQ,
                                          MBEDTLS_OID_SIZE( MBEDTLS_OID_PKCS9_CSR_EXT_REQ ) ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                        MBEDTLS_ASN1_SEQUENCE ) );
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_CONTEXT_SPECIFIC ) );

    MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_pk_write_pubkey_der( ctx->key,
                                                tmp_buf, c - tmp_buf ) );
    c -= pub_len;
    len += pub_len;

    /*
     *  Subject  ::=  Name
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_names( &c, tmp_buf, ctx->subject ) );

    /*
     *  Version  ::=  INTEGER  {  v1(0), v2(1), v3(2)  }
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, tmp_buf, 0 ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );

    /*
     * Prepare signature
     */
    mbedtls_md( mbedtls_md_info_from_type( ctx->md_alg ), c, len, hash );

    pk_alg = mbedtls_pk_get_type( ctx->key );
    if( pk_alg == MBEDTLS_PK_ECKEY )
        pk_alg = MBEDTLS_PK_ECDSA;

    if( ( ret = mbedtls_pk_sign( ctx->key, ctx->md_alg, hash, 0, sig, &sig_len,
                         f_rng, p_rng ) ) != 0 ||
        ( ret = mbedtls_oid_get_oid_by_sig_alg( pk_alg, ctx->md_alg,
                                        &sig_oid, &sig_oid_len ) ) != 0 )
    {
        return( ret );
    }

    /*
     * Write data to output buffer
     */
    c2 = buf + size;
    MBEDTLS_ASN1_CHK_ADD( sig_and_oid_len, mbedtls_x509_write_sig( &c2, buf,
                                        sig_oid, sig_oid_len, sig, sig_len ) );

    if( len > (size_t)( c2 - buf ) )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    c2 -= len;
    memcpy( c2, c, len );

    len += sig_and_oid_len;
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c2, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c2, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                 MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}